

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(ConfidentialTxInReference *this)

{
  ConfidentialTxInReference *in_RDI;
  
  ~ConfidentialTxInReference(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ConfidentialTxInReference() {
    // do nothing
  }